

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPServer.cpp
# Opt level: O0

void __thiscall UDPServer::respond<dto::Simple>(UDPServer *this,Poll *p,Simple *dto)

{
  ostream *poVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>
  local_70;
  undefined1 local_40 [8];
  string resp_str;
  Simple *dto_local;
  Poll *p_local;
  UDPServer *this_local;
  
  resp_str.field_2._8_8_ = dto;
  poVar1 = std::operator<<((ostream *)&std::cout,"UDPServer: responding ");
  poVar1 = operator<<(poVar1,dto);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  ::dto::marshall<dto::Simple>((string *)local_40,dto);
  std::make_pair<std::__cxx11::string,sockaddr_in&>
            (&local_70,(string *)local_40,&this->current_client);
  std::
  queue<std::pair<std::__cxx11::string,sockaddr_in>,std::deque<std::pair<std::__cxx11::string,sockaddr_in>,std::allocator<std::pair<std::__cxx11::string,sockaddr_in>>>>
  ::emplace<std::pair<std::__cxx11::string,sockaddr_in>>
            ((queue<std::pair<std::__cxx11::string,sockaddr_in>,std::deque<std::pair<std::__cxx11::string,sockaddr_in>,std::allocator<std::pair<std::__cxx11::string,sockaddr_in>>>>
              *)&this->msg_queue,&local_70);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>
  ::~pair(&local_70);
  Subscriber::set_expected(&this->super_Subscriber,5);
  Poll::notify_subscriber_changed(p,&this->super_Subscriber);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void UDPServer::respond(Poll &p, T dto) {
  std::cout << "UDPServer: responding " << dto << std::endl;
  auto resp_str = dto::marshall(dto);
  msg_queue.emplace(std::make_pair(std::move(resp_str), current_client));
  set_expected(POLLIN | POLLOUT);
  p.notify_subscriber_changed(*this);
}